

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int vrna_E_ext_loop(vrna_fold_compound_t *fc,int i,int j)

{
  short *psVar1;
  int *piVar2;
  char *ptype_00;
  vrna_param_t *p;
  vrna_sc_t *pvVar3;
  uchar uVar4;
  uint uVar5;
  int iVar6;
  int local_a4;
  int local_a0;
  undefined1 local_98 [8];
  default_data hc_dat_local;
  vrna_callback_hc_evaluate *evaluate;
  vrna_sc_t *sc;
  vrna_md_t *md;
  vrna_param_t *P;
  int *idx;
  int e;
  int en;
  int ij;
  uint type;
  short *S;
  char *ptype;
  int j_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  psVar1 = (fc->field_23).field_0.sequence_encoding;
  piVar2 = fc->jindx;
  ptype_00 = (fc->field_23).field_0.ptype;
  p = fc->params;
  pvVar3 = (fc->field_23).field_0.sc;
  hc_dat_local.hc_f = prepare_hc_default(fc,(default_data *)local_98);
  idx._0_4_ = 10000000;
  uVar5 = vrna_get_ptype(piVar2[j] + i,ptype_00);
  uVar4 = (*hc_dat_local.hc_f)(i,j,i,j,'\x0e',local_98);
  if (uVar4 != '\0') {
    iVar6 = (p->model_details).dangles;
    if ((iVar6 == 0) || (iVar6 != 2)) {
      idx._0_4_ = vrna_E_ext_stem(uVar5,-1,-1,p);
    }
    else {
      idx._0_4_ = vrna_E_ext_stem(uVar5,(int)psVar1[i + -1],(int)psVar1[j + 1],p);
    }
    if ((pvVar3 != (vrna_sc_t *)0x0) && (pvVar3->f != (vrna_callback_sc_energy *)0x0)) {
      iVar6 = (*pvVar3->f)(i,j,i,j,'\x0e',pvVar3->data);
      idx._0_4_ = iVar6 + (int)idx;
    }
  }
  if ((p->model_details).dangles % 2 != 0) {
    iVar6 = piVar2[j + -1];
    uVar4 = (*hc_dat_local.hc_f)(i,j,i,j + -1,'\x0e',local_98);
    if (uVar4 != '\0') {
      uVar5 = vrna_get_ptype(iVar6 + i,ptype_00);
      idx._4_4_ = vrna_E_ext_stem(uVar5,-1,(int)psVar1[j],p);
      if ((pvVar3 != (vrna_sc_t *)0x0) && (pvVar3->f != (vrna_callback_sc_energy *)0x0)) {
        iVar6 = (*pvVar3->f)(i,j,i,j + -1,'\x0e',pvVar3->data);
        idx._4_4_ = iVar6 + idx._4_4_;
      }
      if ((int)idx < idx._4_4_) {
        local_a0 = (int)idx;
      }
      else {
        local_a0 = idx._4_4_;
      }
      idx._0_4_ = local_a0;
    }
    iVar6 = piVar2[j];
    uVar4 = (*hc_dat_local.hc_f)(i,j,i + 1,j,'\x0e',local_98);
    if (uVar4 != '\0') {
      uVar5 = vrna_get_ptype(iVar6 + i + 1,ptype_00);
      idx._4_4_ = vrna_E_ext_stem(uVar5,(int)psVar1[i],-1,p);
      if ((pvVar3 != (vrna_sc_t *)0x0) && (pvVar3->f != (vrna_callback_sc_energy *)0x0)) {
        iVar6 = (*pvVar3->f)(i,j,i + 1,j,'\x0e',pvVar3->data);
        idx._4_4_ = iVar6 + idx._4_4_;
      }
      if ((int)idx < idx._4_4_) {
        local_a4 = (int)idx;
      }
      else {
        local_a4 = idx._4_4_;
      }
      idx._0_4_ = local_a4;
    }
  }
  return (int)idx;
}

Assistant:

PUBLIC int
vrna_E_ext_loop(vrna_fold_compound_t  *fc,
                int                   i,
                int                   j)
{
  char                      *ptype;
  short                     *S;
  unsigned int              type;
  int                       ij, en, e, *idx;
  vrna_param_t              *P;
  vrna_md_t                 *md;
  vrna_sc_t                 *sc;
  vrna_callback_hc_evaluate *evaluate;
  struct default_data       hc_dat_local;

  S         = fc->sequence_encoding;
  idx       = fc->jindx;
  ptype     = fc->ptype;
  P         = fc->params;
  md        = &(P->model_details);
  sc        = fc->sc;
  evaluate  = prepare_hc_default(fc, &hc_dat_local);

  e     = INF;
  ij    = idx[j] + i;
  type  = vrna_get_ptype(ij, ptype);

  if (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
    switch (md->dangles) {
      case 2:
        e = vrna_E_ext_stem(type, S[i - 1], S[j + 1], P);
        break;

      case 0:
      /* fall through */

      default:
        e = vrna_E_ext_stem(type, -1, -1, P);
        break;
    }
    if (sc)
      if (sc->f)
        e += sc->f(i, j, i, j, VRNA_DECOMP_EXT_STEM, sc->data);
  }

  if (md->dangles % 2) {
    ij = idx[j - 1] + i;
    if (evaluate(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
      type = vrna_get_ptype(ij, ptype);

      en = vrna_E_ext_stem(type, -1, S[j], P);

      if (sc)
        if (sc->f)
          en += sc->f(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, sc->data);

      e = MIN2(e, en);
    }

    ij = idx[j] + i + 1;
    if (evaluate(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, &hc_dat_local)) {
      type = vrna_get_ptype(ij, ptype);

      en = vrna_E_ext_stem(type, S[i], -1, P);

      if (sc)
        if (sc->f)
          en += sc->f(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, sc->data);

      e = MIN2(e, en);
    }
  }

  return e;
}